

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O3

void __thiscall polyscope::TransformationGizmo::prepare(TransformationGizmo *this)

{
  pointer pvVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  ShaderProgram *pSVar4;
  Engine *pEVar5;
  pointer pbVar6;
  pointer pbVar7;
  _Alloc_hider _Var8;
  size_type sVar9;
  long lVar10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<glm::vec<3,_float,_(glm::qualifier)0>_> __l_01;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  coords;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  normals;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  colors;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  texcoords;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  center;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  components;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  undefined1 *local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [32];
  pointer local_1e8 [2];
  vec<2,_float,_(glm::qualifier)0> local_1d8;
  vec<3,_float,_(glm::qualifier)0> *local_1c8;
  pointer local_1c0;
  vec<3,_float,_(glm::qualifier)0> local_1b8;
  pointer local_1a8 [2];
  vec<3,_float,_(glm::qualifier)0> local_198;
  undefined1 local_188 [24];
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pEVar5 = render::engine;
  pvVar1 = (pointer)(local_208 + 0x10);
  local_208._0_8_ = pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"TRANSFORMATION_GIZMO_ROT","")
  ;
  local_258._0_8_ = (pointer)0x0;
  local_258._8_8_ = (pointer)0x0;
  local_258._16_8_ = (pointer)0x0;
  (*pEVar5->_vptr_Engine[0x23])(&local_2b8,pEVar5,local_208,local_258,2);
  pbVar7 = local_2b8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar6 = local_2b8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var2 = (this->ringProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->ringProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pbVar6;
  (this->ringProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar7;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (local_2b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_2b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_258);
  if ((pointer)local_208._0_8_ != pvVar1) {
    operator_delete((void *)local_208._0_8_);
  }
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.field_2._M_allocated_capacity = 0;
  local_278.field_2._M_allocated_capacity = 0;
  local_228.field_2._M_allocated_capacity = 0;
  local_188._16_8_ = 0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298._M_dataplus._M_p = (pointer)0x0;
  local_298._M_string_length = 0;
  local_278._M_dataplus._M_p = (pointer)0x0;
  local_278._M_string_length = 0;
  local_228._M_dataplus._M_p = (pointer)0x0;
  local_228._M_string_length = 0;
  local_188._0_8_ = (pointer)0x0;
  local_188._8_8_ = 0;
  triplePlaneCoords((tuple<std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                     *)local_208,this);
  local_258._0_8_ = local_188;
  local_258._8_8_ = &local_228;
  local_258._16_8_ = &local_278;
  local_240 = &local_298;
  local_238 = (undefined1 *)&local_2b8;
  std::
  _Tuple_impl<0ul,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&>
  ::
  _M_assign<std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>,std::vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>>
            ((_Tuple_impl<0ul,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&>
              *)local_258,
             (_Tuple_impl<0UL,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
              *)local_208);
  if (local_1a8[0] != (pointer)0x0) {
    operator_delete(local_1a8[0]);
  }
  if (local_1c0 != (pointer)0x0) {
    operator_delete(local_1c0);
  }
  if (local_1d8 != (vec<2,_float,_(glm::qualifier)0>)0x0) {
    operator_delete((void *)local_1d8);
  }
  if ((pointer)local_208._24_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._24_8_);
  }
  if ((pointer)local_208._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._0_8_);
  }
  peVar3 = (this->ringProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"a_position","");
  (*peVar3->_vptr_ShaderProgram[0x10])(peVar3,local_50,&local_2b8,0,0,0xffffffff);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  peVar3 = (this->ringProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"a_normal","");
  (*peVar3->_vptr_ShaderProgram[0x10])(peVar3,local_70,&local_298,0,0,0xffffffff);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  peVar3 = (this->ringProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"a_color","");
  (*peVar3->_vptr_ShaderProgram[0x10])(peVar3,local_90,&local_278,0,0,0xffffffff);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  peVar3 = (this->ringProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"a_texcoord","");
  (*peVar3->_vptr_ShaderProgram[0xf])(peVar3,local_b0,&local_228,0,0,0xffffffff);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  peVar3 = (this->ringProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"a_component","");
  (*peVar3->_vptr_ShaderProgram[0x10])(peVar3,local_d0,local_188,0,0,0xffffffff);
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  if ((pointer)local_188._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_188._0_8_);
  }
  if (local_228._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  if (local_278._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if ((element_type *)local_298._M_dataplus._M_p != (element_type *)0x0) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  if (local_2b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  pEVar5 = render::engine;
  local_258._0_8_ = local_258 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"RAYCAST_VECTOR","");
  local_208._0_8_ = pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"VECTOR_PROPAGATE_COLOR","");
  local_1e8[0] = (pointer)&local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"TRANSFORMATION_GIZMO_VEC","")
  ;
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"SHADE_COLOR","");
  local_1a8[0] = &local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"LIGHT_MATCAP","");
  __l._M_len = 4;
  __l._M_array = (iterator)local_208;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2b8,__l,(allocator_type *)&local_278);
  (*pEVar5->_vptr_Engine[0x23])(&local_298,pEVar5,local_258,&local_2b8,2);
  sVar9 = local_298._M_string_length;
  _Var8._M_p = local_298._M_dataplus._M_p;
  local_298._M_dataplus._M_p = (pointer)0x0;
  local_298._M_string_length = 0;
  p_Var2 = (this->arrowProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->arrowProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var8._M_p;
  (this->arrowProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar9;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._M_string_length);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b8);
  lVar10 = 0;
  do {
    if ((void *)((long)&local_198.field_0 + lVar10) != *(void **)((long)local_1a8 + lVar10)) {
      operator_delete(*(void **)((long)local_1a8 + lVar10));
    }
    lVar10 = lVar10 + -0x20;
  } while (lVar10 != -0x80);
  if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
    operator_delete((void *)local_258._0_8_);
  }
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.field_2._M_allocated_capacity = 0;
  local_278.field_2._M_allocated_capacity = 0;
  local_228.field_2._M_allocated_capacity = 0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298._M_dataplus._M_p = (pointer)0x0;
  local_298._M_string_length = 0;
  local_278._M_dataplus._M_p = (pointer)0x0;
  local_278._M_string_length = 0;
  local_228._M_dataplus._M_p = (pointer)0x0;
  local_228._M_string_length = 0;
  tripleArrowCoords((tuple<std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                     *)local_208,this);
  local_258._8_8_ = &local_278;
  local_258._0_8_ = &local_228;
  local_258._16_8_ = &local_298;
  local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2b8;
  std::
  _Tuple_impl<0ul,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&>
  ::
  _M_assign<std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>>
            ((_Tuple_impl<0ul,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&>
              *)local_258,
             (_Tuple_impl<0UL,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
              *)local_208);
  pvVar1 = (pointer)(local_208 + 0x10);
  if (local_1c0 != (pointer)0x0) {
    operator_delete(local_1c0);
  }
  if (local_1d8 != (vec<2,_float,_(glm::qualifier)0>)0x0) {
    operator_delete((void *)local_1d8);
  }
  if ((pointer)local_208._24_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._24_8_);
  }
  if ((pointer)local_208._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._0_8_);
  }
  peVar3 = (this->arrowProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"a_vector","");
  (*peVar3->_vptr_ShaderProgram[0x10])(peVar3,local_f0,&local_2b8,0,0,0xffffffff);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0]);
  }
  peVar3 = (this->arrowProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"a_position","");
  (*peVar3->_vptr_ShaderProgram[0x10])(peVar3,local_110,&local_298,0,0,0xffffffff);
  if (local_110[0] != local_100) {
    operator_delete(local_110[0]);
  }
  peVar3 = (this->arrowProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"a_color","");
  (*peVar3->_vptr_ShaderProgram[0x10])(peVar3,local_130,&local_278,0,0,0xffffffff);
  if (local_130[0] != local_120) {
    operator_delete(local_130[0]);
  }
  peVar3 = (this->arrowProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_150[0] = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"a_component","");
  (*peVar3->_vptr_ShaderProgram[0x10])(peVar3,local_150,&local_228,0,0,0xffffffff);
  if (local_150[0] != local_140) {
    operator_delete(local_150[0]);
  }
  pEVar5 = render::engine;
  pSVar4 = (this->arrowProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_208._0_8_ = pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"wax","");
  render::Engine::setMaterial(pEVar5,pSVar4,(string *)local_208);
  if ((pointer)local_208._0_8_ != pvVar1) {
    operator_delete((void *)local_208._0_8_);
  }
  if (local_228._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  if (local_278._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if ((element_type *)local_298._M_dataplus._M_p != (element_type *)0x0) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  if (local_2b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  pEVar5 = render::engine;
  local_258._0_8_ = local_258 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"RAYCAST_SPHERE","");
  local_208._0_8_ = pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"SHADE_BASECOLOR","");
  local_1e8[0] = (pointer)&local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"LIGHT_MATCAP","");
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_208;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2b8,__l_00,(allocator_type *)&local_278);
  (*pEVar5->_vptr_Engine[0x23])(&local_298,pEVar5,local_258,&local_2b8,2);
  sVar9 = local_298._M_string_length;
  _Var8._M_p = local_298._M_dataplus._M_p;
  local_298._M_dataplus._M_p = (pointer)0x0;
  local_298._M_string_length = 0;
  p_Var2 = (this->sphereProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->sphereProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var8._M_p;
  (this->sphereProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar9;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._M_string_length);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b8);
  lVar10 = 0;
  do {
    if ((void *)((long)&local_1d8.field_0 + lVar10) != *(void **)((long)local_1e8 + lVar10)) {
      operator_delete(*(void **)((long)local_1e8 + lVar10));
    }
    lVar10 = lVar10 + -0x20;
  } while (lVar10 != -0x40);
  if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
    operator_delete((void *)local_258._0_8_);
  }
  pEVar5 = render::engine;
  pSVar4 = (this->sphereProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_208._0_8_ = pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"wax","");
  render::Engine::setMaterial(pEVar5,pSVar4,(string *)local_208);
  if ((pointer)local_208._0_8_ != pvVar1) {
    operator_delete((void *)local_208._0_8_);
  }
  local_258._0_8_ = (pointer)0x0;
  local_258._8_8_ = local_258._8_8_ & 0xffffffff00000000;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_258;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)local_208,__l_01,(allocator_type *)&local_2b8);
  peVar3 = (this->sphereProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"a_position","");
  (*peVar3->_vptr_ShaderProgram[0x10])(peVar3,local_170,local_208,0,0,0xffffffff);
  if (local_170[0] != local_160) {
    operator_delete(local_170[0]);
  }
  if ((pointer)local_208._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._0_8_);
  }
  return;
}

Assistant:

void TransformationGizmo::prepare() {

  { // The rotation rings, drawn via textured quads
    ringProgram =
        render::engine->requestShader("TRANSFORMATION_GIZMO_ROT", {}, render::ShaderReplacementDefaults::Process);

    std::vector<glm::vec3> coords;
    std::vector<glm::vec3> normals;
    std::vector<glm::vec3> colors;
    std::vector<glm::vec2> texcoords;
    std::vector<glm::vec3> components;
    std::tie(coords, normals, colors, texcoords, components) = triplePlaneCoords();

    ringProgram->setAttribute("a_position", coords);
    ringProgram->setAttribute("a_normal", normals);
    ringProgram->setAttribute("a_color", colors);
    ringProgram->setAttribute("a_texcoord", texcoords);
    ringProgram->setAttribute("a_component", components);

    // render::engine->setMaterial(*ringProgram, "wax");
  }

  { // Translation arrows
    arrowProgram = render::engine->requestShader(
        "RAYCAST_VECTOR", {"VECTOR_PROPAGATE_COLOR", "TRANSFORMATION_GIZMO_VEC", "SHADE_COLOR", "LIGHT_MATCAP"},
        render::ShaderReplacementDefaults::Process);

    std::vector<glm::vec3> vectors;
    std::vector<glm::vec3> bases;
    std::vector<glm::vec3> colors;
    std::vector<glm::vec3> components;
    std::tie(vectors, bases, colors, components) = tripleArrowCoords();

    arrowProgram->setAttribute("a_vector", vectors);
    arrowProgram->setAttribute("a_position", bases);
    arrowProgram->setAttribute("a_color", colors);
    arrowProgram->setAttribute("a_component", components);

    render::engine->setMaterial(*arrowProgram, "wax");
  }

  { // Scale sphere
    sphereProgram = render::engine->requestShader("RAYCAST_SPHERE", {"SHADE_BASECOLOR", "LIGHT_MATCAP"},
                                                  render::ShaderReplacementDefaults::Process);
    render::engine->setMaterial(*sphereProgram, "wax");

    std::vector<glm::vec3> center = {glm::vec3(0., 0., 0.)};
    sphereProgram->setAttribute("a_position", center);
  }
}